

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O0

void poly3_rand(poly3 *p)

{
  ulong local_18;
  size_t j;
  poly3 *p_local;
  
  RAND_bytes((uchar *)p,0xb0);
  (p->s).v[10] = (p->s).v[10] & 0x1fffffffffffffff;
  (p->a).v[10] = (p->a).v[10] & 0x1fffffffffffffff;
  for (local_18 = 0; local_18 < 0xb; local_18 = local_18 + 1) {
    (p->a).v[local_18] = (p->s).v[local_18] | (p->a).v[local_18];
  }
  return;
}

Assistant:

static void poly3_rand(poly3 *p) {
  RAND_bytes(reinterpret_cast<uint8_t *>(p), sizeof(poly3));
  p->s.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << BITS_IN_LAST_WORD) - 1;
  p->a.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << BITS_IN_LAST_WORD) - 1;
  // (s, a) = (1, 0) is invalid. Map those to -1.
  for (size_t j = 0; j < WORDS_PER_POLY; j++) {
    p->a.v[j] |= p->s.v[j];
  }
}